

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O1

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetDevice
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,
          IOTHUB_DEVICE *deviceInfo)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
  IOTHUB_DEVICE_OR_MODULE local_c0;
  
  if ((deviceId == (char *)0x0 || registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
      deviceInfo == (IOTHUB_DEVICE *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else {
      IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_GetDevice",0x642,1,"Input parameter cannot be NULL");
    }
  }
  else {
    memset(&local_c0,0,0xa0);
    IVar1 = IoTHubRegistryManager_GetDeviceOrModule
                      (registryManagerHandle,deviceId,(char *)0x0,&local_c0);
    if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
      deviceInfo->deviceId = local_c0.deviceId;
      deviceInfo->primaryKey = local_c0.primaryKey;
      deviceInfo->secondaryKey = local_c0.secondaryKey;
      deviceInfo->generationId = local_c0.generationId;
      deviceInfo->eTag = local_c0.eTag;
      deviceInfo->connectionState = local_c0.connectionState;
      deviceInfo->connectionStateUpdatedTime = local_c0.connectionStateUpdatedTime;
      deviceInfo->status = local_c0.status;
      deviceInfo->statusReason = local_c0.statusReason;
      deviceInfo->statusUpdatedTime = local_c0.statusUpdatedTime;
      deviceInfo->lastActivityTime = local_c0.lastActivityTime;
      deviceInfo->cloudToDeviceMessageCount = local_c0.cloudToDeviceMessageCount;
      deviceInfo->isManaged = local_c0.isManaged;
      deviceInfo->configuration = local_c0.configuration;
      deviceInfo->deviceProperties = local_c0.deviceProperties;
      deviceInfo->serviceProperties = local_c0.serviceProperties;
      deviceInfo->authMethod = local_c0.authMethod;
      free(local_c0.moduleId);
      local_c0.moduleId = (char *)0x0;
      free(local_c0.managedBy);
    }
  }
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetDevice(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, IOTHUB_DEVICE* deviceInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (deviceInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
        memset(&deviceOrModuleInfo, 0, sizeof(deviceOrModuleInfo));

        result = IoTHubRegistryManager_GetDeviceOrModule(registryManagerHandle, deviceId, NULL, &deviceOrModuleInfo);
        if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_device(&deviceOrModuleInfo, deviceInfo);
            free_nonDevice_members_from_deviceOrModule(&deviceOrModuleInfo);
        }
    }

    return result;
}